

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::DoGlobalSetup(FGameConfigFile *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FBaseCVar *pFVar4;
  size_t sVar5;
  float fVar6;
  double dVar7;
  FBaseCVar *dim;
  bool more;
  size_t namelen;
  char *name;
  FBaseCVar *precache;
  FBaseCVar *vsync;
  FBaseCVar *noblitter;
  double last;
  char *lastver;
  FGameConfigFile *this_local;
  
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"GlobalSettings.Unknown",false);
  if (bVar1) {
    ReadCVars(this,0x400);
  }
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"GlobalSettings",false);
  if (bVar1) {
    ReadCVars(this,0x400);
    ConvertHQResizeMode(&this->super_FConfigFile);
  }
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"LastRun",false);
  if ((bVar1) &&
     (pcVar3 = FConfigFile::GetValueForKey(&this->super_FConfigFile,"Version"),
     pcVar3 != (char *)0x0)) {
    dVar7 = atof(pcVar3);
    if ((dVar7 < 123.1) &&
       (pFVar4 = FindCVar("vid_noblitter",(FBaseCVar **)0x0), pFVar4 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar4);
    }
    if ((dVar7 < 202.0) &&
       (bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"Hexen.Bindings",false), bVar1)) {
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"\\","use ArtiHealth",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"scroll","+showscores",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"0","useflechette",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"9","use ArtiBlastRadius",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"8","use ArtiTeleport",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"7","use ArtiTeleportOther",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"6","use ArtiPork",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"5","use ArtiInvulnerability2",false);
    }
    if ((dVar7 < 204.0) &&
       (pFVar4 = FindCVar("vid_vsync",(FBaseCVar **)0x0), pFVar4 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar4);
    }
    if ((dVar7 < 206.0) && (fVar6 = FFloatCVar::operator_cast_to_float(&spc_amp), 16.0 < fVar6)) {
      fVar6 = FFloatCVar::operator_cast_to_float(&spc_amp);
      FFloatCVar::operator=(&spc_amp,fVar6 / 16.0);
    }
    if ((dVar7 < 207.0) &&
       (pFVar4 = FindCVar("snd_midiprecache",(FBaseCVar **)0x0), pFVar4 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar4);
    }
    if (dVar7 < 208.0) {
      dim._7_1_ = FConfigFile::SetFirstSection(&this->super_FConfigFile);
      while (dim._7_1_ != false) {
        pcVar3 = FConfigFile::GetCurrentSection(&this->super_FConfigFile);
        if (((pcVar3 == (char *)0x0) || (sVar5 = strlen(pcVar3), sVar5 < 0xd)) ||
           (iVar2 = strcmp(pcVar3 + (sVar5 - 0xc),".WeaponSlots"), iVar2 != 0)) {
          dim._7_1_ = FConfigFile::SetNextSection(&this->super_FConfigFile);
        }
        else {
          dim._7_1_ = FConfigFile::DeleteCurrentSection(&this->super_FConfigFile);
        }
      }
    }
    if ((dVar7 < 209.0) &&
       (pFVar4 = FindCVar("dimamount",(FBaseCVar **)0x0), pFVar4 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar4);
    }
    if ((dVar7 < 210.0) &&
       (bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"Hexen.Bindings",false), bVar1)) {
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"6","use ArtiPork",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"5","use ArtiInvulnerability2",false);
    }
  }
  return;
}

Assistant:

void FGameConfigFile::DoGlobalSetup ()
{
	if (SetSection ("GlobalSettings.Unknown"))
	{
		ReadCVars (CVAR_GLOBALCONFIG);
	}
	if (SetSection ("GlobalSettings"))
	{
		ReadCVars (CVAR_GLOBALCONFIG);

		ConvertHQResizeMode(*this);
	}
	if (SetSection ("LastRun"))
	{
		const char *lastver = GetValueForKey ("Version");
		if (lastver != NULL)
		{
			double last = atof (lastver);
			if (last < 123.1)
			{
				FBaseCVar *noblitter = FindCVar ("vid_noblitter", NULL);
				if (noblitter != NULL)
				{
					noblitter->ResetToDefault ();
				}
			}
			if (last < 202)
			{
				// Make sure the Hexen hotkeys are accessible by default.
				if (SetSection ("Hexen.Bindings"))
				{
					SetValueForKey ("\\", "use ArtiHealth");
					SetValueForKey ("scroll", "+showscores");
					SetValueForKey ("0", "useflechette");
					SetValueForKey ("9", "use ArtiBlastRadius");
					SetValueForKey ("8", "use ArtiTeleport");
					SetValueForKey ("7", "use ArtiTeleportOther");
					SetValueForKey ("6", "use ArtiPork");
					SetValueForKey ("5", "use ArtiInvulnerability2");
				}
			}
			if (last < 204)
			{ // The old default for vsync was true, but with an unlimited framerate
			  // now, false is a better default.
				FBaseCVar *vsync = FindCVar ("vid_vsync", NULL);
				if (vsync != NULL)
				{
					vsync->ResetToDefault ();
				}
			}
			if (last < 206)
			{ // spc_amp is now a float, not an int.
				if (spc_amp > 16)
				{
					spc_amp = spc_amp / 16.f;
				}
			}
			if (last < 207)
			{ // Now that snd_midiprecache works again, you probably don't want it on.
				FBaseCVar *precache = FindCVar ("snd_midiprecache", NULL);
				if (precache != NULL)
				{
					precache->ResetToDefault();
				}
			}
			if (last < 208)
			{ // Weapon sections are no longer used, so tidy up the config by deleting them.
				const char *name;
				size_t namelen;
				bool more;

				more = SetFirstSection();
				while (more)
				{
					name = GetCurrentSection();
					if (name != NULL && 
						(namelen = strlen(name)) > 12 &&
						strcmp(name + namelen - 12, ".WeaponSlots") == 0)
					{
						more = DeleteCurrentSection();
					}
					else
					{
						more = SetNextSection();
					}
				}
			}
			if (last < 209)
			{
				// menu dimming is now a gameinfo option so switch user override off
				FBaseCVar *dim = FindCVar ("dimamount", NULL);
				if (dim != NULL)
				{
					dim->ResetToDefault ();
				}
			}
			if (last < 210)
			{
				if (SetSection ("Hexen.Bindings"))
				{
					// These 2 were misnamed in earlier versions
					SetValueForKey ("6", "use ArtiPork");
					SetValueForKey ("5", "use ArtiInvulnerability2");
				}
			}
		}
	}
}